

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_interpreter_loadSourceNamedWithSolvedPath(sysbvm_context_t *context,sysbvm_tuple_t filename)

{
  anon_struct_24_3_0e92dec2 gcFrame;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  local_30 = (undefined1 *)&local_68;
  local_68 = 0;
  sStack_60 = 0;
  local_58 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_68 = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context,filename);
  sStack_60 = sysbvm_environment_createDefaultForSourceCodeEvaluation(context,local_68);
  local_58 = sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment
                       (context,sStack_60,local_68);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_58;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_loadSourceNamedWithSolvedPath(sysbvm_context_t *context, sysbvm_tuple_t filename)
{
    struct {
        sysbvm_tuple_t sourceCode;
        sysbvm_tuple_t sourceEnvironment;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.sourceCode = sysbvm_interpreter_loadSourceCodeWithSolvedPath(context, filename);
    gcFrame.sourceEnvironment = sysbvm_environment_createDefaultForSourceCodeEvaluation(context, gcFrame.sourceCode);
    gcFrame.result = sysbvm_interpreter_validateThenAnalyzeAndEvaluateSourceCodeWithEnvironment(context, gcFrame.sourceEnvironment, gcFrame.sourceCode);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}